

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::CollectSideEffectsForTarget
          (cmComputeTargetDepends *this,set<int,_std::less<int>,_std::allocator<int>_> *visited,
          int depender_index)

{
  int iVar1;
  pointer pTVar2;
  pointer pcVar3;
  pointer pTVar4;
  size_type sVar5;
  long lVar6;
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  *this_00;
  _Base_ptr p_Var7;
  cmGraphEdge *edge;
  pointer pcVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *sideEffects;
  int local_4c;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_48;
  pointer local_40;
  pointer local_38;
  
  local_4c = depender_index;
  local_48 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)visited;
  sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(visited,&local_4c);
  if (sVar5 == 0) {
    lVar6 = (long)local_4c;
    pTVar2 = (this->SideEffects).
             super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar4 = pTVar2 + lVar6;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>(local_48,&local_4c);
    local_40 = pTVar4;
    cmGeneratorTarget::AppendCustomCommandSideEffects
              ((this->Targets).
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_start[local_4c],&pTVar4->CustomCommandSideEffects
              );
    sideEffects = &pTVar2[lVar6].LanguageSideEffects;
    cmGeneratorTarget::AppendLanguageSideEffects
              ((this->Targets).
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_start[local_4c],sideEffects);
    pcVar3 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = *(pointer *)
                ((long)&pcVar3[local_4c].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
    for (pcVar8 = *(pointer *)
                   &pcVar3[local_4c].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        pcVar8 != local_38; pcVar8 = pcVar8 + 1) {
      CollectSideEffectsForTarget
                (this,(set<int,_std::less<int>,_std::allocator<int>_> *)local_48,pcVar8->Dest);
      iVar1 = pcVar8->Dest;
      pTVar4 = (this->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmGeneratorTarget_const*>>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)local_40,
                 *(_Base_ptr *)((long)&pTVar4[iVar1].CustomCommandSideEffects._M_t._M_impl + 0x18),
                 (_Base_ptr)((long)&pTVar4[iVar1].CustomCommandSideEffects._M_t._M_impl + 8));
      for (p_Var7 = *(_Base_ptr *)((long)&pTVar4[iVar1].LanguageSideEffects._M_t._M_impl + 0x18);
          p_Var7 != (_Rb_tree_node_base *)
                    ((long)&pTVar4[iVar1].LanguageSideEffects._M_t._M_impl + 8U);
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        this_00 = (_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                     ::operator[](sideEffects,(key_type *)(p_Var7 + 1));
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmGeneratorTarget_const*>>
                  (this_00,p_Var7[2]._M_right,
                   (_Rb_tree_const_iterator<const_cmGeneratorTarget_*>)&p_Var7[2]._M_parent);
      }
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectSideEffectsForTarget(
  std::set<int>& visited, int depender_index)
{
  if (!visited.count(depender_index)) {
    auto& se = this->SideEffects[depender_index];
    visited.insert(depender_index);
    this->Targets[depender_index]->AppendCustomCommandSideEffects(
      se.CustomCommandSideEffects);
    this->Targets[depender_index]->AppendLanguageSideEffects(
      se.LanguageSideEffects);

    for (auto const& edge : this->InitialGraph[depender_index]) {
      this->CollectSideEffectsForTarget(visited, edge);
      auto const& dse = this->SideEffects[edge];
      se.CustomCommandSideEffects.insert(dse.CustomCommandSideEffects.cbegin(),
                                         dse.CustomCommandSideEffects.cend());
      for (auto const& it : dse.LanguageSideEffects) {
        se.LanguageSideEffects[it.first].insert(it.second.cbegin(),
                                                it.second.cend());
      }
    }
  }
}